

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdvariablebyte.h
# Opt level: O2

string * __thiscall
FastPForLib::MaskedVByte::name_abi_cxx11_(string *__return_storage_ptr__,MaskedVByte *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"MaskedVByte",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return "MaskedVByte"; }